

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O1

void __thiscall so_5::agent_t::shutdown_agent(agent_t *this)

{
  long *plVar1;
  event_queue_t *peVar2;
  bool bVar3;
  agent_t *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined *local_28;
  long *local_20;
  code *local_18;
  
  LOCK();
  bVar3 = (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
  if (bVar3) {
    (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
  }
  UNLOCK();
  if (!bVar3) {
    do {
      if ((this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0) {
        LOCK();
        bVar3 = (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
        if (bVar3) {
          (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
        }
        UNLOCK();
        if (bVar3) break;
      }
      sched_yield();
    } while( true );
  }
  peVar2 = this->m_event_queue;
  if (peVar2 == (event_queue_t *)0x0) {
    details::invoke_noexcept_code<so_5::agent_t::shutdown_agent()::__1>
              ((anon_class_8_1_8991fb9c)this);
    abort();
  }
  local_38 = 0;
  uStack_30 = 0;
  local_28 = &void::typeinfo;
  local_20 = (long *)0x0;
  local_18 = demand_handler_on_finish;
  local_40 = this;
  (*peVar2->_vptr_event_queue_t[2])(peVar2,&local_40);
  if (local_20 != (long *)0x0) {
    LOCK();
    plVar1 = local_20 + 1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if ((*plVar1 == 0) && (local_20 != (long *)0x0)) {
      (**(code **)(*local_20 + 8))();
    }
  }
  this->m_event_queue = (event_queue_t *)0x0;
  LOCK();
  (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i =
       (this->m_event_queue_lock).m_counters.super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

void
agent_t::shutdown_agent() SO_5_NOEXCEPT
{
	std::lock_guard< default_rw_spinlock_t > queue_lock{ m_event_queue_lock };

	// Since v.5.5.8 shutdown is done by two simple step:
	// - remove actual value from m_event_queue;
	// - pushing final demand to actual event queue.
	// 
	// No new demands will be sent to the agent, but all the subscriptions
	// remains. They will be destroyed at the very end of agent's lifetime.

	if( m_event_queue )
	{
		// Final event must be pushed to queue.
		so_5::details::invoke_noexcept_code( [&] {
				m_event_queue->push(
						execution_demand_t(
								this,
								message_limit::control_block_t::none(),
								0,
								typeid(void),
								message_ref_t(),
								&agent_t::demand_handler_on_finish ) );
			} );

		// No more events will be stored to the queue.
		m_event_queue = nullptr;
	}
	else
		so_5::details::abort_on_fatal_error( [&] {
			SO_5_LOG_ERROR( so_environment(), log_stream )
			{
				log_stream << "Unexpected error: m_event_queue contains "
					"nullptr. Unable to push demand_handler_on_finish for "
					"the agent (" << this << "). Application will be aborted"
					<< std::endl;
			}
		} );
}